

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDocPtr xmlReadMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt;
  xmlDocPtr pxVar1;
  
  xmlInitParser();
  ctxt = xmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    pxVar1 = xmlDoRead(ctxt,URL,encoding,options,0);
    return pxVar1;
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlReadMemory(const char *buffer, int size, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = xmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL)
        return (NULL);
    return (xmlDoRead(ctxt, URL, encoding, options, 0));
}